

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5HighlightFunction
               (Fts5ExtensionApi *pApi,Fts5Context *pFts,sqlite3_context *pCtx,int nVal,
               sqlite3_value **apVal)

{
  int iVar1;
  ulong uVar2;
  int rc;
  HighlightContext ctx;
  int local_9c;
  HighlightContext local_98;
  
  if (nVal != 3) {
    pCtx->isError = 1;
    sqlite3VdbeMemSetStr
              (pCtx->pOut,"wrong number of arguments to function highlight()",-1,'\x01',
               (_func_void_void_ptr *)0xffffffffffffffff);
    return;
  }
  uVar2 = sqlite3VdbeIntValue(*apVal);
  local_98.iter.pApi = (Fts5ExtensionApi *)0x0;
  local_98.iter.pFts = (Fts5Context *)0x0;
  local_98.iter.iCol = 0;
  local_98.iter.iInst = 0;
  local_98.iter.nInst = 0;
  local_98.iter.iStart = 0;
  local_98.iter.iEnd = 0;
  local_98.iter._36_4_ = 0;
  local_98.iPos = 0;
  local_98.iRangeStart = 0;
  local_98.iRangeEnd = 0;
  local_98._52_4_ = 0;
  local_98.zOpen = (char *)0x0;
  local_98.zClose = (char *)0x0;
  local_98.zIn = (char *)0x0;
  local_98.nIn = 0;
  local_98.iOff = 0;
  local_98.zOut = (char *)0x0;
  local_98.zOpen = (char *)sqlite3ValueText(apVal[1],'\x01');
  local_98.zClose = (char *)sqlite3ValueText(apVal[2],'\x01');
  local_9c = (*pApi->xColumnText)(pFts,(int)uVar2,&local_98.zIn,&local_98.nIn);
  if (local_98.zIn != (char *)0x0) {
    iVar1 = local_9c;
    if (local_9c == 0) {
      local_98.iter.nInst = 0;
      local_98.iter.iStart = 0;
      local_98.iter.iEnd = 0;
      local_98.iter._36_4_ = 0;
      local_98.iter._16_8_ = uVar2 & 0xffffffff;
      local_98.iter.pApi = pApi;
      local_98.iter.pFts = pFts;
      iVar1 = (*pApi->xInstCount)(pFts,&local_98.iter.nInst);
      if (iVar1 == 0) {
        iVar1 = fts5CInstIterNext(&local_98.iter);
      }
    }
    local_9c = iVar1;
    if (local_9c == 0) {
      local_9c = (*pApi->xTokenize)(pFts,local_98.zIn,local_98.nIn,&local_98,fts5HighlightCb);
    }
    fts5HighlightAppend(&local_9c,&local_98,local_98.zIn + local_98.iOff,
                        local_98.nIn - local_98.iOff);
    if (local_9c == 0) {
      setResultStrOrError(pCtx,local_98.zOut,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
    }
    sqlite3_free(local_98.zOut);
  }
  if (local_9c != 0) {
    sqlite3_result_error_code(pCtx,local_9c);
  }
  return;
}

Assistant:

static void fts5HighlightFunction(
  const Fts5ExtensionApi *pApi,   /* API offered by current FTS version */
  Fts5Context *pFts,              /* First arg to pass to pApi functions */
  sqlite3_context *pCtx,          /* Context for returning result/error */
  int nVal,                       /* Number of values in apVal[] array */
  sqlite3_value **apVal           /* Array of trailing arguments */
){
  HighlightContext ctx;
  int rc;
  int iCol;

  if( nVal!=3 ){
    const char *zErr = "wrong number of arguments to function highlight()";
    sqlite3_result_error(pCtx, zErr, -1);
    return;
  }

  iCol = sqlite3_value_int(apVal[0]);
  memset(&ctx, 0, sizeof(HighlightContext));
  ctx.zOpen = (const char*)sqlite3_value_text(apVal[1]);
  ctx.zClose = (const char*)sqlite3_value_text(apVal[2]);
  rc = pApi->xColumnText(pFts, iCol, &ctx.zIn, &ctx.nIn);

  if( ctx.zIn ){
    if( rc==SQLITE_OK ){
      rc = fts5CInstIterInit(pApi, pFts, iCol, &ctx.iter);
    }

    if( rc==SQLITE_OK ){
      rc = pApi->xTokenize(pFts, ctx.zIn, ctx.nIn, (void*)&ctx,fts5HighlightCb);
    }
    fts5HighlightAppend(&rc, &ctx, &ctx.zIn[ctx.iOff], ctx.nIn - ctx.iOff);

    if( rc==SQLITE_OK ){
      sqlite3_result_text(pCtx, (const char*)ctx.zOut, -1, SQLITE_TRANSIENT);
    }
    sqlite3_free(ctx.zOut);
  }
  if( rc!=SQLITE_OK ){
    sqlite3_result_error_code(pCtx, rc);
  }
}